

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenGlobalSetSetName(BinaryenExpressionRef expr,char *name)

{
  Name local_28;
  
  if (expr->_id != GlobalSetId) {
    __assert_fail("expression->is<GlobalSet>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x9a0,"void BinaryenGlobalSetSetName(BinaryenExpressionRef, const char *)");
  }
  if (name != (char *)0x0) {
    wasm::Name::Name(&local_28,name);
    *(size_t *)(expr + 1) = local_28.super_IString.str._M_len;
    expr[1].type.id = (uintptr_t)local_28.super_IString.str._M_str;
    return;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x9a1,"void BinaryenGlobalSetSetName(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenGlobalSetSetName(BinaryenExpressionRef expr, const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<GlobalSet>());
  assert(name);
  static_cast<GlobalSet*>(expression)->name = name;
}